

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void satoko_unbookmark(satoko_t *s)

{
  satoko_t *s_local;
  
  if (s->status == 1) {
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_cdb = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    (s->opts).no_simplify = '\0';
    return;
  }
  __assert_fail("s->status == SATOKO_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                ,0x1cb,"void satoko_unbookmark(satoko_t *)");
}

Assistant:

void satoko_unbookmark(satoko_t *s)
{
    // printf("[Satoko] Unbookmark.\n");
    assert(s->status == SATOKO_OK);
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_cdb = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    // s->book_qhead = 0;
    s->opts.no_simplify = 0;
}